

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int getAndInitPage(BtShared *pBt,Pgno pgno,MemPage **ppPage,BtCursor *pCur,int bReadOnly)

{
  char cVar1;
  int iVar2;
  u8 uVar3;
  MemPage *pPage;
  DbPage *pDbPage;
  DbPage *local_30;
  
  if (pBt->nPage < pgno) {
    iVar2 = 0xb;
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xff8c,
                "fc82b73eaac8b36950e527f12c4b5dc1e147e6f4ad2217ae43ad82882a88bfa6");
    goto LAB_00176c7c;
  }
  iVar2 = (*pBt->pPager->xGet)(pBt->pPager,pgno,&local_30,bReadOnly);
  if (iVar2 != 0) goto LAB_00176c7c;
  pPage = (MemPage *)local_30->pExtra;
  *ppPage = pPage;
  if (pPage->isInit == '\0') {
    if (pPage->pgno != pgno) {
      pPage->aData = (u8 *)local_30->pData;
      pPage->pDbPage = local_30;
      pPage->pBt = pBt;
      pPage->pgno = pgno;
      uVar3 = 'd';
      if (pgno != 1) {
        uVar3 = '\0';
      }
      pPage->hdrOffset = uVar3;
      pPage = *ppPage;
    }
    iVar2 = btreeInitPage(pPage);
    if (iVar2 == 0) goto LAB_00176cbc;
  }
  else {
LAB_00176cbc:
    if (pCur == (BtCursor *)0x0) {
      return 0;
    }
    if (((*ppPage)->nCell != 0) && ((*ppPage)->intKey == pCur->curIntKey)) {
      return 0;
    }
    iVar2 = 0xb;
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xffa1,
                "fc82b73eaac8b36950e527f12c4b5dc1e147e6f4ad2217ae43ad82882a88bfa6");
  }
  if (*ppPage != (MemPage *)0x0) {
    sqlite3PagerUnrefNotNull((*ppPage)->pDbPage);
  }
LAB_00176c7c:
  if (pCur != (BtCursor *)0x0) {
    cVar1 = pCur->iPage + -1;
    pCur->iPage = cVar1;
    pCur->pPage = pCur->apPage[cVar1];
  }
  return iVar2;
}

Assistant:

static int getAndInitPage(
  BtShared *pBt,                  /* The database file */
  Pgno pgno,                      /* Number of the page to get */
  MemPage **ppPage,               /* Write the page pointer here */
  BtCursor *pCur,                 /* Cursor to receive the page, or NULL */
  int bReadOnly                   /* True for a read-only page */
){
  int rc;
  DbPage *pDbPage;
  assert( sqlite3_mutex_held(pBt->mutex) );
  assert( pCur==0 || ppPage==&pCur->pPage );
  assert( pCur==0 || bReadOnly==pCur->curPagerFlags );
  assert( pCur==0 || pCur->iPage>0 );

  if( pgno>btreePagecount(pBt) ){
    rc = SQLITE_CORRUPT_BKPT;
    goto getAndInitPage_error1;
  }
  rc = sqlite3PagerGet(pBt->pPager, pgno, (DbPage**)&pDbPage, bReadOnly);
  if( rc ){
    goto getAndInitPage_error1;
  }
  *ppPage = (MemPage*)sqlite3PagerGetExtra(pDbPage);
  if( (*ppPage)->isInit==0 ){
    btreePageFromDbPage(pDbPage, pgno, pBt);
    rc = btreeInitPage(*ppPage);
    if( rc!=SQLITE_OK ){
      goto getAndInitPage_error2;
    }
  }
  assert( (*ppPage)->pgno==pgno );
  assert( (*ppPage)->aData==sqlite3PagerGetData(pDbPage) );

  /* If obtaining a child page for a cursor, we must verify that the page is
  ** compatible with the root page. */
  if( pCur && ((*ppPage)->nCell<1 || (*ppPage)->intKey!=pCur->curIntKey) ){
    rc = SQLITE_CORRUPT_PGNO(pgno);
    goto getAndInitPage_error2;
  }
  return SQLITE_OK;

getAndInitPage_error2:
  releasePage(*ppPage);
getAndInitPage_error1:
  if( pCur ){
    pCur->iPage--;
    pCur->pPage = pCur->apPage[pCur->iPage];
  }
  testcase( pgno==0 );
  assert( pgno!=0 || rc==SQLITE_CORRUPT );
  return rc;
}